

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

bool __thiscall
Remapper::remap_stage_input(Remapper *this,D3DStageIO *d3d_input,VulkanStageIO *vk_input)

{
  dxil_spv_bool dVar1;
  bool bVar2;
  dxil_spv_d3d_shader_stage_io c_input;
  dxil_spv_vulkan_shader_stage_io local_38;
  dxil_spv_d3d_shader_stage_io local_28;
  
  local_28.semantic = d3d_input->semantic;
  local_28.semantic_index = d3d_input->semantic_index;
  local_28.start_row = 0;
  local_28.rows = 0;
  local_38.location = vk_input->location;
  local_38.component = vk_input->component;
  local_38.flags = vk_input->flags;
  bVar2 = true;
  if (this->stage_input_remapper != (dxil_spv_shader_stage_io_remapper_cb)0x0) {
    dVar1 = (*this->stage_input_remapper)(this->stage_input_userdata,&local_28,&local_38);
    if (dVar1 == '\x01') {
      vk_input->location = local_38.location;
      vk_input->component = local_38.component;
      vk_input->flags = local_38.flags;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool remap_stage_input(const D3DStageIO &d3d_input, VulkanStageIO &vk_input) override
	{
		dxil_spv_d3d_shader_stage_io c_input = { d3d_input.semantic, d3d_input.semantic_index };
		dxil_spv_vulkan_shader_stage_io c_vk_input = { vk_input.location, vk_input.component, vk_input.flags };

		if (stage_input_remapper)
		{
			if (stage_input_remapper(stage_input_userdata, &c_input, &c_vk_input) == DXIL_SPV_TRUE)
			{
				vk_input.location = c_vk_input.location;
				vk_input.component = c_vk_input.component;
				vk_input.flags = c_vk_input.flags;
				return true;
			}
			else
				return false;
		}
		else
		{
			return true;
		}
	}